

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O3

int __thiscall
TimedUdpLayer::receiveUdpPacket(TimedUdpLayer *this,void *data,int *size,sockaddr_in *from)

{
  int iVar1;
  time_t tVar2;
  int iVar3;
  
  iVar1 = UdpLayer::receiveUdpPacket(&this->super_UdpLayer,data,size,from);
  iVar3 = -1;
  if (0 < iVar1) {
    if (this->mActive == false) {
      tVar2 = time((time_t *)0x0);
      if (tVar2 < this->mStartTime) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TimedUdpLayer::receiveUdpPacket() Dropping packet (Too Early)",0x3d);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        *size = 0;
        return -1;
      }
      this->mActive = true;
    }
    iVar3 = *size;
  }
  return iVar3;
}

Assistant:

int TimedUdpLayer::receiveUdpPacket(void *data, int *size, struct sockaddr_in &from) {
	if (0 < UdpLayer::receiveUdpPacket(data, size, from)) {
		if (!mActive) {
			if (time(NULL) < mStartTime) {
#ifdef DEBUG_UDP_LAYER 	
#endif
				std::cerr << "TimedUdpLayer::receiveUdpPacket() Dropping packet (Too Early)";
				std::cerr << std::endl;
				//std::cerr << printPkt(data, *size);
				//std::cerr << std::endl;

				*size = 0;
				return -1;
	
			}

			mActive = true;
	
		}

		/* acceptable port */
		return *size;
	}
	return -1;
}